

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O0

uint32_t do_helper_tr(CPUS390XState_conflict *env,uint32_t len,uint64_t array,uint64_t trans,
                     uintptr_t ra)

{
  uint32_t uVar1;
  uint local_34;
  uint8_t new_byte;
  uint8_t byte;
  uint32_t i;
  uintptr_t ra_local;
  uint64_t trans_local;
  uint64_t array_local;
  uint32_t len_local;
  CPUS390XState_conflict *env_local;
  
  for (local_34 = 0; local_34 <= len; local_34 = local_34 + 1) {
    uVar1 = cpu_ldub_data_ra_s390x(env,array + local_34,ra);
    uVar1 = cpu_ldub_data_ra_s390x(env,trans + (byte)uVar1,ra);
    cpu_stb_data_ra_s390x(env,array + local_34,uVar1 & 0xff,ra);
  }
  return env->cc_op;
}

Assistant:

static uint32_t do_helper_tr(CPUS390XState *env, uint32_t len, uint64_t array,
                             uint64_t trans, uintptr_t ra)
{
    uint32_t i;

    for (i = 0; i <= len; i++) {
        uint8_t byte = cpu_ldub_data_ra(env, array + i, ra);
        uint8_t new_byte = cpu_ldub_data_ra(env, trans + byte, ra);
        cpu_stb_data_ra(env, array + i, new_byte, ra);
    }

    return env->cc_op;
}